

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QTime *time)

{
  long lVar1;
  int iVar2;
  undefined4 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 ds;
  quint32 *in_stack_ffffffffffffffc8;
  QDataStream *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar2 = QDataStream::version(in_RDI);
  if (iVar2 < 7) {
    *in_RSI = 0xaaaaaaaa;
  }
  else {
    *in_RSI = 0xaaaaaaaa;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QTime &time)
{
    quint32 ds;
    in >> ds;
    if (in.version() >= QDataStream::Qt_4_0) {
        time.mds = int(ds);
    } else {
        // Qt3 would write 0 for a null time
        time.mds = (ds == 0) ? QTime::NullTime : int(ds);
    }
    return in;
}